

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall wabt::interp::Memory::Fill(Memory *this,u32 offset,u8 value,u32 size)

{
  pointer puVar1;
  Enum EVar2;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  EVar2 = Error;
  if ((ulong)size + (ulong)offset <=
      (ulong)((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
    EVar2 = Ok;
    if (size != 0) {
      memset(puVar1 + offset,(uint)value,(ulong)size);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::Fill(u32 offset, u8 value, u32 size) {
  if (IsValidAccess(offset, 0, size)) {
    std::fill(data_.begin() + offset, data_.begin() + offset + size, value);
    return Result::Ok;
  }
  return Result::Error;
}